

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

void __thiscall
csm::ModelIdentifier::ModelIdentifier(ModelIdentifier *this,string *argName,string *argValue)

{
  string *__x;
  Data local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  local_58;
  string *local_20;
  string *argValue_local;
  string *argName_local;
  ModelIdentifier *this_local;
  
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl = 0;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  local_20 = argValue;
  argValue_local = argName;
  argName_local = (string *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>_>
  ::map(&this->theComponents);
  __x = argValue_local;
  MIC::Data::Data(&local_70,local_20);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>(&local_58,__x,&local_70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>_>_>
  ::insert(&this->theComponents,&local_58);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::~pair(&local_58);
  MIC::Data::~Data(&local_70);
  return;
}

Assistant:

ModelIdentifier::ModelIdentifier(const std::string& argName,
                                  const std::string& argValue)
   :
      theComponents()
{
   theComponents.insert(MIComponent(argName,MIC::Data(argValue)));
}